

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O0

vector<const_RenX::PlayerInfo_*,_std::allocator<const_RenX::PlayerInfo_*>_> * __thiscall
RenX::Server::activePlayers
          (vector<const_RenX::PlayerInfo_*,_std::allocator<const_RenX::PlayerInfo_*>_>
           *__return_storage_ptr__,Server *this,bool includeBots)

{
  bool bVar1;
  size_type __n;
  reference local_58;
  reference local_50;
  PlayerInfo *player;
  const_iterator __end1;
  const_iterator __begin1;
  list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_> *__range1;
  bool includeBots_local;
  Server *this_local;
  vector<const_RenX::PlayerInfo_*,_std::allocator<const_RenX::PlayerInfo_*>_> *result;
  
  std::vector<const_RenX::PlayerInfo_*,_std::allocator<const_RenX::PlayerInfo_*>_>::vector
            (__return_storage_ptr__);
  __n = std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::size
                  (&this->players);
  std::vector<const_RenX::PlayerInfo_*,_std::allocator<const_RenX::PlayerInfo_*>_>::reserve
            (__return_storage_ptr__,__n);
  __end1 = std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::begin
                     (&this->players);
  player = (PlayerInfo *)
           std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::end
                     (&this->players);
  while (bVar1 = std::operator==(&__end1,(_Self *)&player), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_50 = std::_List_const_iterator<RenX::PlayerInfo>::operator*(&__end1);
    if ((local_50->team != None) && ((includeBots || ((local_50->isBot & 1U) == 0)))) {
      local_58 = local_50;
      std::vector<const_RenX::PlayerInfo_*,_std::allocator<const_RenX::PlayerInfo_*>_>::push_back
                (__return_storage_ptr__,&local_58);
    }
    std::_List_const_iterator<RenX::PlayerInfo>::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<const RenX::PlayerInfo*> RenX::Server::activePlayers(bool includeBots) const {
	std::vector<const RenX::PlayerInfo*> result;
	result.reserve(players.size());

	// Build list of active players
	for (auto& player : players) {
		// Filter teamless players and bots (if applicable)
		if (player.team != TeamType::None && (includeBots || !player.isBot)) {
			result.push_back(&player);
		}
	}

	return result;
}